

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void btreeEndTransaction(Btree *p)

{
  BtShared *pBVar1;
  int iVar2;
  BtLock *pBVar3;
  BtLock *pBVar4;
  ushort uVar5;
  BtLock **ppBVar6;
  
  pBVar1 = p->pBt;
  pBVar1->bDoTruncate = '\0';
  if (p->inTrans == '\0') goto LAB_00133255;
  if (1 < p->db->activeVdbeCnt) {
    if (pBVar1->pWriter == p) {
      pBVar1->pWriter = (Btree *)0x0;
      *(byte *)&pBVar1->btsFlags = (byte)pBVar1->btsFlags & 0x9f;
      for (pBVar4 = pBVar1->pLock; pBVar4 != (BtLock *)0x0; pBVar4 = pBVar4->pNext) {
        pBVar4->eLock = '\x01';
      }
    }
    p->inTrans = '\x01';
    return;
  }
  if (pBVar1->pLock != (BtLock *)0x0) {
    ppBVar6 = &pBVar1->pLock;
    pBVar4 = pBVar1->pLock;
    do {
      if (pBVar4->pBtree == p) {
        pBVar3 = pBVar4->pNext;
        *ppBVar6 = pBVar3;
        if (pBVar4->iTable != 1) {
          sqlite3_free(pBVar4);
          goto LAB_001331ee;
        }
      }
      else {
        ppBVar6 = &pBVar4->pNext;
LAB_001331ee:
        pBVar3 = *ppBVar6;
      }
      pBVar4 = pBVar3;
    } while (pBVar3 != (BtLock *)0x0);
  }
  if (pBVar1->pWriter == p) {
    pBVar1->pWriter = (Btree *)0x0;
    iVar2 = pBVar1->nTransaction;
    uVar5 = 0xff9f;
LAB_00133243:
    pBVar1->btsFlags = pBVar1->btsFlags & uVar5;
  }
  else {
    iVar2 = pBVar1->nTransaction;
    if (iVar2 == 2) {
      uVar5 = 0xffbf;
      iVar2 = 2;
      goto LAB_00133243;
    }
  }
  pBVar1->nTransaction = iVar2 + -1;
  if (iVar2 + -1 == 0) {
    pBVar1->inTransaction = '\0';
  }
LAB_00133255:
  p->inTrans = '\0';
  if ((pBVar1->inTransaction == '\0') && (pBVar1->pPage1 != (MemPage *)0x0)) {
    sqlite3PagerUnref(pBVar1->pPage1->pDbPage);
    pBVar1->pPage1 = (MemPage *)0x0;
  }
  return;
}

Assistant:

static void btreeEndTransaction(Btree *p){
  BtShared *pBt = p->pBt;
  assert( sqlite3BtreeHoldsMutex(p) );

#ifndef SQLITE_OMIT_AUTOVACUUM
  pBt->bDoTruncate = 0;
#endif
  if( p->inTrans>TRANS_NONE && p->db->activeVdbeCnt>1 ){
    /* If there are other active statements that belong to this database
    ** handle, downgrade to a read-only transaction. The other statements
    ** may still be reading from the database.  */
    downgradeAllSharedCacheTableLocks(p);
    p->inTrans = TRANS_READ;
  }else{
    /* If the handle had any kind of transaction open, decrement the 
    ** transaction count of the shared btree. If the transaction count 
    ** reaches 0, set the shared state to TRANS_NONE. The unlockBtreeIfUnused()
    ** call below will unlock the pager.  */
    if( p->inTrans!=TRANS_NONE ){
      clearAllSharedCacheTableLocks(p);
      pBt->nTransaction--;
      if( 0==pBt->nTransaction ){
        pBt->inTransaction = TRANS_NONE;
      }
    }

    /* Set the current transaction state to TRANS_NONE and unlock the 
    ** pager if this call closed the only read or write transaction.  */
    p->inTrans = TRANS_NONE;
    unlockBtreeIfUnused(pBt);
  }

  btreeIntegrity(p);
}